

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildTestStatFailureAbortsBuild::Run(BuildTestStatFailureAbortsBuild *this)

{
  Test *pTVar1;
  int iVar2;
  bool condition;
  int iVar3;
  char *input;
  mapped_type *pmVar4;
  Node *pNVar5;
  undefined1 local_108 [8];
  string err;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  uint local_94;
  ManifestParserOptions local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_48;
  int fail_count;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string kTooLongToStat;
  BuildTestStatFailureAbortsBuild *this_local;
  
  kTooLongToStat.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,400,'i',&local_31);
  std::allocator<char>::~allocator(&local_31);
  local_48 = testing::Test::AssertionFailures(g_current_test);
  std::operator+(&local_88,"build ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::operator+(&local_68,&local_88,": cat in\n");
  input = (char *)std::__cxx11::string::c_str();
  ManifestParserOptions::ManifestParserOptions(&local_90);
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,input,local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  iVar2 = local_48;
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"in",&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"",(allocator<char> *)(err.field_2._M_local_buf + 0xf));
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_b8,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry>_>_>
             ::operator[](&(this->super_BuildTest).fs_.files_,(key_type *)local_30);
    pmVar4->mtime = -1;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry>_>_>
             ::operator[](&(this->super_BuildTest).fs_.files_,(key_type *)local_30);
    std::__cxx11::string::operator=((string *)&pmVar4->stat_error,"stat failed");
    std::__cxx11::string::string((string *)local_108);
    pTVar1 = g_current_test;
    pNVar5 = Builder::AddTarget(&(this->super_BuildTest).builder_,(string *)local_30,
                                (string *)local_108);
    testing::Test::Check
              (pTVar1,pNVar5 == (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x807,"builder_.AddTarget(kTooLongToStat, &err)");
    pTVar1 = g_current_test;
    condition = std::operator==("stat failed",
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_108);
    testing::Test::Check
              (pTVar1,condition,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x808,"\"stat failed\" == err");
    std::__cxx11::string::~string((string *)local_108);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  local_94 = (uint)(iVar2 != iVar3);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(BuildTest, StatFailureAbortsBuild) {
  const string kTooLongToStat(400, 'i');
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
("build " + kTooLongToStat + ": cat in\n").c_str()));
  fs_.Create("in", "");

  // This simulates a stat failure:
  fs_.files_[kTooLongToStat].mtime = -1;
  fs_.files_[kTooLongToStat].stat_error = "stat failed";

  string err;
  EXPECT_FALSE(builder_.AddTarget(kTooLongToStat, &err));
  EXPECT_EQ("stat failed", err);
}